

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

int green_loop_release(green_loop_t_conflict loop)

{
  int iVar1;
  green_loop_t_conflict loop_local;
  
  if (loop == (green_loop_t_conflict)0x0) {
    fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","loop != ((void*)0)",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
            ,0xaf);
    fflush(_stderr);
    abort();
  }
  if (loop->refs < 1) {
    fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","loop->refs > 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
            ,0xb0);
    fflush(_stderr);
    abort();
  }
  iVar1 = loop->refs + -1;
  loop->refs = iVar1;
  if (iVar1 < 1) {
    if (loop == (green_loop_t_conflict)0x0) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","loop != ((void*)0)",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0xb6);
      fflush(_stderr);
      abort();
    }
    if (loop->coroutines != 0) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","loop->coroutines == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0xb8);
      fflush(_stderr);
      abort();
    }
    green_free(loop);
  }
  return 0;
}

Assistant:

int green_loop_release(green_loop_t loop)
{
    green_assert(loop != NULL);
    green_assert(loop->refs > 0);

    if (--(loop->refs) > 0) {
        return GREEN_SUCCESS;
    }

    green_assert(loop != NULL);

    green_assert(loop->coroutines == 0);
    green_free(loop);

    return GREEN_SUCCESS;
}